

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

Apply * __thiscall jsonnet::internal::Desugarer::stdFunc(Desugarer *this,UString *name,AST *v)

{
  Apply *pAVar1;
  initializer_list<jsonnet::internal::ArgParam> __l;
  bool local_cc;
  bool local_cb;
  allocator_type local_ca;
  bool local_c9;
  Var *local_c8;
  Index *local_c0;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_b8;
  void *local_a0;
  void *local_98;
  LiteralString *local_90;
  ArgParam local_88;
  
  local_c8 = std(this);
  local_c9 = false;
  local_88.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  local_90 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (this->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,name,(TokenKind *)&local_88,(char (*) [1])0x20bbd7,
                        (char (*) [1])0x20bbd7);
  local_98 = (void *)0x0;
  local_a0 = (void *)0x0;
  local_c0 = Allocator::
             make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                       (this->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_c8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_c9,&local_90,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_98,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_a0,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF);
  ArgParam::ArgParam(&local_88,v,(Fodder *)EF);
  __l._M_len = 1;
  __l._M_array = &local_88;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&local_b8,__l,&local_ca);
  local_cb = false;
  local_cc = true;
  pAVar1 = Allocator::
           make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (this->alloc,&v->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_c0,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_b8,&local_cb,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_cc);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (&local_b8);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_88.commaFodder);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_88.eqFodder);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_88.idFodder);
  return pAVar1;
}

Assistant:

Apply *stdFunc(const UString &name, AST *v)
    {
        return make<Apply>(
            v->location,
            EF,
            make<Index>(E, EF, std(), EF, false, str(name), EF, nullptr, EF, nullptr, EF),
            EF,
            ArgParams{{v, EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
    }